

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_address.cpp
# Opt level: O0

size_t miniros::network::getAddressSize(Type type)

{
  Type type_local;
  undefined8 local_8;
  
  if (type == AddressIPv4) {
    local_8 = 0x10;
  }
  else if (type == AddressIPv6) {
    local_8 = 0x1c;
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

size_t getAddressSize(const NetAddress::Type type)
{
  switch (type) {
    case NetAddress::Type::AddressIPv4:
      return sizeof (sockaddr_in);
    case NetAddress::Type::AddressIPv6:
      return sizeof (sockaddr_in6);
    default:
      return 0;
  }
}